

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharBuffer.cpp
# Opt level: O3

int __thiscall antlr::CharBuffer::getChar(CharBuffer *this)

{
  int iVar1;
  
  iVar1 = std::istream::get();
  return iVar1;
}

Assistant:

int CharBuffer::getChar()
{
//	try {
		return input.get();
//	}
//	catch (ANTLR_USE_NAMESPACE(std)ios_base::failure& e) {
//		throw CharStreamIOException(e);
//	}
}